

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                    (&this->message_type_);
  if ((((bVar1) &&
       (bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                          (&this->enum_type_), bVar1)) &&
      (bVar1 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>>
                         (&this->service_), bVar1)) &&
     ((bVar1 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                         (&this->extension_), bVar1 &&
      ((((this->_has_bits_).has_bits_[0] & 8) == 0 ||
       (bVar1 = FileOptions::IsInitialized(this->options_), bVar1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->message_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->service())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}